

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Concat_x86::forward
          (Concat_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t *psVar5;
  pointer pMVar6;
  int *piVar7;
  byte bVar8;
  undefined4 *puVar9;
  int iVar10;
  Mat *pMVar11;
  undefined4 *puVar12;
  void *pvVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  int iVar19;
  undefined4 *puVar20;
  int iVar21;
  int iVar22;
  undefined4 *puVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  size_t sVar27;
  ulong uVar28;
  long lVar29;
  bool bVar30;
  int local_b0;
  Mat local_88;
  Mat *local_40;
  Mat *local_38;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar6->dims;
  iVar26 = *(int *)(&this->field_0xd0 + (long)this->_vptr_Concat_x86[-3]);
  if (uVar1 == 1) {
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      uVar14 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar7 = &pMVar6->w;
      uVar14 = 0;
      do {
        uVar14 = uVar14 + piVar7[-5] * *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar8 = (uVar14 & 3) == 0 & opt->use_packing_layout;
    iVar22 = (uint)bVar8 + (uint)bVar8 * 2 + 1;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,(int)uVar14 / iVar22,
                pMVar6->elemsize / (ulong)(long)pMVar6->elempack << bVar8 * '\x02',iVar22,
                opt->blob_allocator);
    pvVar13 = pMVar11->data;
    if (pvVar13 == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar11->c * pMVar11->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      lVar16 = 0x2c;
      uVar24 = 0;
      do {
        memcpy(pvVar13,*(void **)((long)pMVar6 + lVar16 + -0x2c),
               (long)*(int *)((long)&pMVar6->data + lVar16) *
               *(long *)((long)pMVar6 + lVar16 + -0x1c));
        pvVar13 = (void *)((long)pvVar13 +
                          (long)*(int *)((long)pMVar6 + lVar16 + -0x14) *
                          (long)*(int *)((long)&pMVar6->data + lVar16) * 4);
        uVar24 = uVar24 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = lVar16 + 0x48;
      } while (uVar24 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
  }
  iVar26 = (iVar26 >> 0x1f & uVar1) + iVar26;
  if ((uVar1 == 2) && (iVar26 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = pMVar6->w;
    uVar24 = pMVar6->elemsize;
    iVar15 = pMVar6->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      uVar14 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar7 = &pMVar6->h;
      uVar14 = 0;
      do {
        if (*(ulong *)(piVar7 + -8) < uVar24) {
          uVar24 = *(ulong *)(piVar7 + -8);
        }
        iVar19 = piVar7[-6];
        if (iVar19 < iVar15) {
          iVar15 = iVar19;
        }
        uVar14 = uVar14 + iVar19 * *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar8 = (uVar14 & 3) == 0 & opt->use_packing_layout;
    iVar19 = (uint)bVar8 + (uint)bVar8 * 2 + 1;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,iVar22,(int)uVar14 / iVar19,uVar24 / (ulong)(long)iVar15 << bVar8 * '\x02',
                iVar19,opt->blob_allocator);
    if (pMVar11->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar11->c * pMVar11->cstep == 0) {
      return -100;
    }
    local_88.data = pMVar11->data;
    piVar7 = pMVar11->refcount;
    local_88.refcount._0_4_ = SUB84(piVar7,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar11->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar11->elemsize >> 0x20);
    local_88.elempack = pMVar11->elempack;
    local_88.allocator = pMVar11->allocator;
    local_88.dims = pMVar11->dims;
    local_88.w = pMVar11->w;
    local_88.h = pMVar11->h;
    local_88.d = pMVar11->d;
    local_88.c = pMVar11->c;
    local_88.cstep = pMVar11->cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    local_38 = pMVar11;
    if ((iVar15 < iVar19) &&
       ((Mat::create(&local_88,iVar22,(int)uVar14 / iVar15,uVar24,iVar15,opt->workspace_allocator),
        (undefined4 *)local_88.data == (undefined4 *)0x0 || ((long)local_88.c * local_88.cstep == 0)
        ))) {
      piVar7 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar7 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 != 0) {
        return -100;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return -100;
      }
      goto LAB_00197bfc;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      lVar16 = (long)iVar22;
      pMVar11 = (Mat *)(lVar16 * 4);
      uVar24 = 0;
      puVar12 = (undefined4 *)local_88.data;
      local_40 = pMVar11;
      do {
        pMVar6 = pMVar6 + uVar24;
        iVar10 = pMVar6->elempack;
        if (((iVar10 == 4) && (iVar15 == 1)) && (iVar2 = pMVar6->h, 0 < (long)iVar2)) {
          pvVar13 = pMVar6->data;
          iVar3 = pMVar6->w;
          sVar27 = pMVar6->elemsize;
          lVar17 = 0;
          do {
            if (0 < iVar22) {
              puVar20 = (undefined4 *)((long)iVar3 * sVar27 * lVar17 + (long)pvVar13);
              puVar18 = puVar12;
              iVar21 = iVar22;
              do {
                *puVar18 = *puVar20;
                puVar18[lVar16] = puVar20[1];
                puVar18[iVar22 * 2] = puVar20[2];
                puVar18[iVar22 * 3] = puVar20[3];
                puVar18 = puVar18 + 1;
                puVar20 = puVar20 + 4;
                iVar21 = iVar21 + -1;
              } while (iVar21 != 0);
            }
            puVar12 = puVar12 + (long)pMVar11;
            lVar17 = lVar17 + 1;
          } while (lVar17 != iVar2);
        }
        if (iVar10 == iVar15) {
          lVar17 = pMVar6->h * lVar16;
          memcpy(puVar12,pMVar6->data,pMVar6->elemsize * lVar17);
          local_b0 = (int)lVar17;
          puVar12 = puVar12 + (long)local_b0 * (long)pMVar6->elempack;
          pMVar11 = local_40;
        }
        uVar24 = uVar24 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar24 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar15 < iVar19) {
      convert_packing(&local_88,local_38,iVar19,opt);
    }
    piVar7 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  if ((uVar1 == 2) && (iVar26 == 1)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = pMVar6->h;
    sVar27 = pMVar6->elemsize;
    iVar22 = pMVar6->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      iVar15 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar7 = &pMVar6->w;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,iVar15,uVar14,sVar27,iVar22,opt->blob_allocator);
    if (pMVar11->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar11->c * pMVar11->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    local_40 = (Mat *)((ulong)local_40 & 0xffffffffffffff00);
    if (0 < (int)uVar14) {
      uVar24 = 0;
      do {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar6) {
          pvVar13 = (void *)((long)pMVar11->w * uVar24 * pMVar11->elemsize + (long)pMVar11->data);
          lVar16 = 0x2c;
          uVar28 = 0;
          do {
            lVar17 = (long)*(int *)((long)&pMVar6->data + lVar16);
            memcpy(pvVar13,(void *)(uVar24 * lVar17 * *(long *)((long)pMVar6 + lVar16 + -0x1c) +
                                   *(long *)((long)pMVar6 + lVar16 + -0x2c)),lVar17 * sVar27);
            pvVar13 = (void *)((long)pvVar13 +
                              (long)*(int *)((long)&pMVar6->data + lVar16) * (long)iVar22 * 4);
            uVar28 = uVar28 + 1;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x48;
          } while (uVar28 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar14);
    }
    if ((char)local_40 != '\0') {
      return -100;
    }
  }
  if ((uVar1 == 3) && (iVar26 == 0)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar22 = pMVar6->w;
    iVar15 = pMVar6->h;
    sVar27 = pMVar6->elemsize;
    iVar19 = pMVar6->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      uVar14 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      psVar5 = &pMVar6->elemsize;
      uVar14 = 0;
      do {
        if (*psVar5 < sVar27) {
          sVar27 = *psVar5;
        }
        iVar10 = *(int *)(psVar5 + 1);
        if (iVar10 < iVar19) {
          iVar19 = iVar10;
        }
        uVar14 = uVar14 + iVar10 * *(int *)(psVar5 + 5);
        psVar5 = psVar5 + 9;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    bVar8 = (uVar14 & 3) == 0 & opt->use_packing_layout;
    iVar10 = (uint)bVar8 + (uint)bVar8 * 2 + 1;
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,iVar22,iVar15,(int)uVar14 / iVar10,
                sVar27 / (ulong)(long)iVar19 << bVar8 * '\x02',iVar10,opt->blob_allocator);
    if (pMVar11->data == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar11->c * pMVar11->cstep == 0) {
      return -100;
    }
    local_88.data = pMVar11->data;
    piVar7 = pMVar11->refcount;
    local_88.refcount._0_4_ = SUB84(piVar7,0);
    local_88.refcount._4_4_ = (undefined4)((ulong)piVar7 >> 0x20);
    local_88.elemsize._0_4_ = (undefined4)pMVar11->elemsize;
    local_88.elemsize._4_4_ = (undefined4)(pMVar11->elemsize >> 0x20);
    local_88.elempack = pMVar11->elempack;
    local_88.allocator = pMVar11->allocator;
    local_88.dims = pMVar11->dims;
    local_88.w = pMVar11->w;
    local_88.h = pMVar11->h;
    local_88.d = pMVar11->d;
    local_88.c = pMVar11->c;
    local_88.cstep = pMVar11->cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    if ((iVar19 < iVar10) &&
       ((Mat::create(&local_88,iVar22,iVar15,(int)uVar14 / iVar19,sVar27,iVar19,
                     opt->workspace_allocator), (undefined4 *)local_88.data == (undefined4 *)0x0 ||
        ((long)local_88.c * local_88.cstep == 0)))) {
      piVar7 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar7 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 != 0) {
        return -100;
      }
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        return -100;
      }
LAB_00197bfc:
      if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
        free(local_88.data);
      }
      return -100;
    }
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar6) {
      uVar28 = 0;
      uVar24 = 0;
      do {
        pMVar6 = pMVar6 + uVar28;
        if (((pMVar6->elempack == 4) && (iVar19 == 1)) && (iVar22 = pMVar6->c, 0 < (long)iVar22)) {
          iVar15 = pMVar6->h * pMVar6->w;
          sVar27 = pMVar6->cstep;
          sVar4 = pMVar6->elemsize;
          pvVar13 = pMVar6->data;
          lVar16 = local_88.cstep * CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          uVar24 = (ulong)(int)uVar24;
          puVar20 = (undefined4 *)((uVar24 + 3) * lVar16 + (long)local_88.data);
          puVar23 = (undefined4 *)((uVar24 + 2) * lVar16 + (long)local_88.data);
          puVar12 = (undefined4 *)((uVar24 + 1) * lVar16 + (long)local_88.data);
          puVar18 = (undefined4 *)(lVar16 * uVar24 + (long)local_88.data);
          lVar17 = 0;
          do {
            if (0 < iVar15) {
              puVar9 = (undefined4 *)(sVar27 * sVar4 * lVar17 + (long)pvVar13);
              lVar29 = 0;
              do {
                puVar18[lVar29] = *puVar9;
                puVar12[lVar29] = puVar9[1];
                puVar23[lVar29] = puVar9[2];
                puVar20[lVar29] = puVar9[3];
                puVar9 = puVar9 + 4;
                lVar29 = lVar29 + 1;
              } while (iVar15 != (int)lVar29);
            }
            uVar24 = uVar24 + 4;
            lVar17 = lVar17 + 1;
            puVar20 = puVar20 + lVar16;
            puVar23 = puVar23 + lVar16;
            puVar12 = puVar12 + lVar16;
            puVar18 = puVar18 + lVar16;
          } while (lVar17 != iVar22);
        }
        if (pMVar6->elempack == iVar19) {
          memcpy((undefined4 *)
                 (local_88.cstep * (long)(int)uVar24 *
                  CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) +
                 (long)local_88.data),pMVar6->data,
                 (long)((int)pMVar6->cstep * pMVar6->c) * pMVar6->elemsize);
          uVar24 = (ulong)(uint)((int)uVar24 + pMVar6->c);
        }
        uVar28 = uVar28 + 1;
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar28 < (ulong)(((long)(bottom_blobs->
                                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                       _M_impl.super__Vector_impl_data._M_finish - (long)pMVar6 >> 3
                                ) * -0x71c71c71c71c71c7));
    }
    if (iVar19 < iVar10) {
      convert_packing(&local_88,pMVar11,iVar10,opt);
    }
    piVar7 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_88.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_88.data != (undefined4 *)0x0) {
            free(local_88.data);
          }
        }
        else {
          (*(local_88.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_88.cstep = 0;
    local_88.data = (void *)0x0;
    local_88.refcount._0_4_ = 0;
    local_88.refcount._4_4_ = 0;
    local_88.elemsize._0_4_ = 0;
    local_88.elemsize._4_4_ = 0;
    local_88.elempack = 0;
    local_88.dims = 0;
    local_88.w = 0;
    local_88.h = 0;
    local_88.d = 0;
    local_88.c = 0;
  }
  if ((uVar1 == 3) && (iVar26 == 1)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = pMVar6->c;
    sVar27 = pMVar6->elemsize;
    iVar22 = pMVar6->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      iVar15 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar7 = &pMVar6->h;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,pMVar6->w,iVar15,uVar14,sVar27,iVar22,opt->blob_allocator);
    if (pMVar11->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar11->c * pMVar11->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    local_40 = pMVar11;
    if (0 < (int)uVar14) {
      uVar24 = 0;
      do {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish != pMVar6) {
          pvVar13 = (void *)(local_40->cstep * uVar24 * local_40->elemsize + (long)local_40->data);
          lVar16 = 0x40;
          uVar28 = 0;
          do {
            lVar17 = (long)*(int *)((long)pMVar6 + lVar16 + -0x10) *
                     (long)*(int *)((long)pMVar6 + lVar16 + -0x14);
            memcpy(pvVar13,(void *)(*(long *)((long)&pMVar6->data + lVar16) * uVar24 *
                                    *(long *)((long)pMVar6 + lVar16 + -0x30) +
                                   *(long *)((long)pMVar6 + lVar16 + -0x40)),lVar17 * sVar27);
            pvVar13 = (void *)((long)pvVar13 + (long)((int)lVar17 * iVar22) * 4);
            uVar28 = uVar28 + 1;
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            lVar16 = lVar16 + 0x48;
          } while (uVar28 < (ulong)(((long)(bottom_blobs->
                                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar14);
    }
    if (bVar30) {
      return -100;
    }
  }
  if ((uVar1 == 3) && (iVar26 == 2)) {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar1 = pMVar6->h;
    uVar14 = pMVar6->c;
    sVar27 = pMVar6->elemsize;
    iVar26 = pMVar6->elempack;
    lVar16 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar6;
    if (lVar16 == 0) {
      iVar22 = 0;
    }
    else {
      lVar16 = (lVar16 >> 3) * -0x71c71c71c71c71c7;
      lVar16 = lVar16 + (ulong)(lVar16 == 0);
      piVar7 = &pMVar6->w;
      iVar22 = 0;
      do {
        iVar22 = iVar22 + *piVar7;
        piVar7 = piVar7 + 0x12;
        lVar16 = lVar16 + -1;
      } while (lVar16 != 0);
    }
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    Mat::create(pMVar11,iVar22,uVar1,uVar14,sVar27,iVar26,opt->blob_allocator);
    if (pMVar11->data == (void *)0x0) {
      bVar30 = true;
    }
    else {
      bVar30 = (long)pMVar11->c * pMVar11->cstep == 0;
    }
    if (bVar30) {
      return -100;
    }
    if (0 < (int)uVar14) {
      uVar24 = 0;
      do {
        if (0 < (int)uVar1) {
          pvVar13 = (void *)(pMVar11->cstep * uVar24 * pMVar11->elemsize + (long)pMVar11->data);
          uVar28 = 0;
          do {
            pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish != pMVar6) {
              lVar16 = 0x40;
              uVar25 = 0;
              do {
                lVar29 = (long)*(int *)((long)pMVar6 + lVar16 + -0x14);
                lVar17 = *(long *)((long)pMVar6 + lVar16 + -0x30);
                memcpy(pvVar13,(void *)(uVar28 * lVar29 * lVar17 +
                                       *(long *)((long)&pMVar6->data + lVar16) * uVar24 * lVar17 +
                                       *(long *)((long)pMVar6 + lVar16 + -0x40)),lVar29 * sVar27);
                pvVar13 = (void *)((long)pvVar13 +
                                  (long)*(int *)((long)pMVar6 + lVar16 + -0x14) * (long)iVar26 * 4);
                uVar25 = uVar25 + 1;
                pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start;
                lVar16 = lVar16 + 0x48;
              } while (uVar25 < (ulong)(((long)(bottom_blobs->
                                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pMVar6 >> 3) * -0x71c71c71c71c71c7));
            }
            uVar28 = uVar28 + 1;
          } while (uVar28 != uVar1);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar14);
    }
    if (bVar30) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int Concat_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_w % 16 == 0 ? 16 : top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_w % 8 == 0 ? 8 : top_w % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_w % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        float* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            const float* ptr = bottom_blob;
            memcpy(outptr, ptr, bottom_blob.w * bottom_blob.elemsize);

            outptr += bottom_blob.w * bottom_blob.elempack;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_h += bottom_blob.h * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_h % 16 == 0 ? 16 : top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_h % 8 == 0 ? 8 : top_h % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_h % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, top_h / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        float* outptr = top_blob_unpacked;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 8;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;
                    float* outptr2 = outptr + w * 8;
                    float* outptr3 = outptr + w * 12;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;
                    float* outptr8 = outptr + w * 8;
                    float* outptr9 = outptr + w * 9;
                    float* outptra = outptr + w * 10;
                    float* outptrb = outptr + w * 11;
                    float* outptrc = outptr + w * 12;
                    float* outptrd = outptr + w * 13;
                    float* outptre = outptr + w * 14;
                    float* outptrf = outptr + w * 15;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    outptr += w * 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w * 4;

                    for (int j = 0; j < w; j++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;
                    float* outptr4 = outptr + w * 4;
                    float* outptr5 = outptr + w * 5;
                    float* outptr6 = outptr + w * 6;
                    float* outptr7 = outptr + w * 7;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    outptr += w * 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                for (int i = 0; i < bottom_blob.h; i++)
                {
                    const float* r0 = bottom_blob.row(i);

                    float* outptr0 = outptr;
                    float* outptr1 = outptr + w;
                    float* outptr2 = outptr + w * 2;
                    float* outptr3 = outptr + w * 3;

                    for (int j = 0; j < w; j++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    outptr += w * 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8 16-16
            {
                int size = w * bottom_blob.h;

                const float* ptr = bottom_blob;
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                outptr += size * bottom_blob.elempack;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* outptr = top_blob.row(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const float* ptr = bottom_blob.row(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            elemsize = std::min(elemsize, bottom_blob.elemsize);
            elempack = std::min(elempack, bottom_blob.elempack);
            top_channels += bottom_blob.c * bottom_blob.elempack;
        }

        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            out_elempack = top_channels % 16 == 0 ? 16 : top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = top_channels % 8 == 0 ? 8 : top_channels % 4 == 0 ? 4 : 1;
#else
            out_elempack = top_channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__
        size_t out_elemsize = elemsize / elempack * out_elempack;

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        Mat top_blob_unpacked = top_blob;
        if (elempack < out_elempack)
        {
            top_blob_unpacked.create(w, h, top_channels / elempack, elemsize, elempack, opt.workspace_allocator);
            if (top_blob_unpacked.empty())
                return -100;
        }

        int p = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

#if __AVX__
#if __AVX512F__
            if (bottom_blob.elempack == 16 && elempack == 8)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr0[4] = r0[4];
                        outptr0[5] = r0[5];
                        outptr0[6] = r0[6];
                        outptr0[7] = r0[7];
                        outptr1[0] = r0[8];
                        outptr1[1] = r0[9];
                        outptr1[2] = r0[10];
                        outptr1[3] = r0[11];
                        outptr1[4] = r0[12];
                        outptr1[5] = r0[13];
                        outptr1[6] = r0[14];
                        outptr1[7] = r0[15];

                        outptr0 += 8;
                        outptr1 += 8;
                        r0 += 16;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];
                        outptr2[0] = r0[8];
                        outptr2[1] = r0[9];
                        outptr2[2] = r0[10];
                        outptr2[3] = r0[11];
                        outptr3[0] = r0[12];
                        outptr3[1] = r0[13];
                        outptr3[2] = r0[14];
                        outptr3[3] = r0[15];

                        outptr0 += 4;
                        outptr1 += 4;
                        outptr2 += 4;
                        outptr3 += 4;
                        r0 += 16;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == 16 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);
                    float* outptr8 = top_blob_unpacked.channel(p + 8);
                    float* outptr9 = top_blob_unpacked.channel(p + 9);
                    float* outptra = top_blob_unpacked.channel(p + 10);
                    float* outptrb = top_blob_unpacked.channel(p + 11);
                    float* outptrc = top_blob_unpacked.channel(p + 12);
                    float* outptrd = top_blob_unpacked.channel(p + 13);
                    float* outptre = top_blob_unpacked.channel(p + 14);
                    float* outptrf = top_blob_unpacked.channel(p + 15);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];
                        *outptr8++ = r0[8];
                        *outptr9++ = r0[9];
                        *outptra++ = r0[10];
                        *outptrb++ = r0[11];
                        *outptrc++ = r0[12];
                        *outptrd++ = r0[13];
                        *outptre++ = r0[14];
                        *outptrf++ = r0[15];

                        r0 += 16;
                    }

                    p += 16;
                }
            }
#endif // __AVX512F__
            if (bottom_blob.elempack == 8 && elempack == 4)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);

                    for (int i = 0; i < size; i++)
                    {
                        outptr0[0] = r0[0];
                        outptr0[1] = r0[1];
                        outptr0[2] = r0[2];
                        outptr0[3] = r0[3];
                        outptr1[0] = r0[4];
                        outptr1[1] = r0[5];
                        outptr1[2] = r0[6];
                        outptr1[3] = r0[7];

                        outptr0 += 4;
                        outptr1 += 4;
                        r0 += 8;
                    }

                    p += 2;
                }
            }
            if (bottom_blob.elempack == 8 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);
                    float* outptr4 = top_blob_unpacked.channel(p + 4);
                    float* outptr5 = top_blob_unpacked.channel(p + 5);
                    float* outptr6 = top_blob_unpacked.channel(p + 6);
                    float* outptr7 = top_blob_unpacked.channel(p + 7);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];
                        *outptr4++ = r0[4];
                        *outptr5++ = r0[5];
                        *outptr6++ = r0[6];
                        *outptr7++ = r0[7];

                        r0 += 8;
                    }

                    p += 8;
                }
            }
#endif // __AVX__
            if (bottom_blob.elempack == 4 && elempack == 1)
            {
                int size = bottom_blob.w * bottom_blob.h;

                for (int q = 0; q < bottom_blob.c; q++)
                {
                    const float* r0 = bottom_blob.channel(q);

                    float* outptr0 = top_blob_unpacked.channel(p);
                    float* outptr1 = top_blob_unpacked.channel(p + 1);
                    float* outptr2 = top_blob_unpacked.channel(p + 2);
                    float* outptr3 = top_blob_unpacked.channel(p + 3);

                    for (int i = 0; i < size; i++)
                    {
                        *outptr0++ = r0[0];
                        *outptr1++ = r0[1];
                        *outptr2++ = r0[2];
                        *outptr3++ = r0[3];

                        r0 += 4;
                    }

                    p += 4;
                }
            }
            if (bottom_blob.elempack == elempack) // 1-1 4-4 8-8
            {
                int size = bottom_blob.total();

                const float* ptr = bottom_blob;
                float* outptr = top_blob_unpacked.channel(p);
                memcpy(outptr, ptr, size * bottom_blob.elemsize);

                p += bottom_blob.c;
            }
        }

        // packing
        if (elempack < out_elempack)
        {
            convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        }
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const float* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elempack;
            }
        }
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;
        size_t elemsize = bottom_blobs[0].elemsize;
        int elempack = bottom_blobs[0].elempack;

        // total height
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const float* ptr = bottom_blob.channel(q).row(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elempack;
                }
            }
        }
    }

    return 0;
}